

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O1

void __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>::rec_coface
          (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence> *this,
          vector<short,_std::allocator<short>_> *vertices,Siblings *curr_sib,int curr_nbVertices,
          vector<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>_>_>
          *cofaces,bool star,int nbVertices)

{
  short sVar1;
  pointer psVar2;
  pointer psVar3;
  iterator iVar4;
  iterator __position;
  Vertex_handle tmp;
  short local_42;
  uint local_40;
  int local_3c;
  vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
  local_38;
  
  if ((curr_nbVertices <= nbVertices || star) &&
     (local_38.m_ptr =
           (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>
            *)(curr_sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_start,
     (curr_sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_size != 0)) {
    local_3c = curr_nbVertices + 1;
    local_40 = (uint)star;
    do {
      psVar2 = (vertices->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
               super__Vector_impl_data._M_start;
      psVar3 = (vertices->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (psVar2 == psVar3) {
        if (curr_nbVertices == nbVertices || star) {
          iVar4._M_current =
               (cofaces->
               super__Vector_base<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (cofaces->
              super__Vector_base<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>_>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<boost::container::vec_iterator<std::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>>>*,true>,std::allocator<boost::container::vec_iterator<std::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>>>*,true>>>
            ::
            _M_realloc_insert<boost::container::vec_iterator<std::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>>>*,true>const&>
                      ((vector<boost::container::vec_iterator<std::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>>>*,true>,std::allocator<boost::container::vec_iterator<std::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>>>*,true>>>
                        *)cofaces,iVar4,&local_38);
          }
          else {
            (iVar4._M_current)->m_ptr = local_38.m_ptr;
            (cofaces->
            super__Vector_base<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>_>_>
            )._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
          }
          if (!star) goto LAB_001643de;
        }
        if ((((local_38.m_ptr)->second).children_)->parent_ == (local_38.m_ptr)->first) {
LAB_0016432f:
          rec_coface(this,vertices,((local_38.m_ptr)->second).children_,local_3c,cofaces,
                     SUB41(local_40,0),nbVertices);
        }
      }
      else {
        sVar1 = (local_38.m_ptr)->first;
        if (sVar1 == psVar3[-1]) {
          if ((long)psVar3 - (long)psVar2 == 2 && (curr_nbVertices == nbVertices || star)) {
            iVar4._M_current =
                 (cofaces->
                 super__Vector_base<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (cofaces->
                super__Vector_base<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>_>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<boost::container::vec_iterator<std::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>>>*,true>,std::allocator<boost::container::vec_iterator<std::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>>>*,true>>>
              ::
              _M_realloc_insert<boost::container::vec_iterator<std::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>>>*,true>const&>
                        ((vector<boost::container::vec_iterator<std::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>>>*,true>,std::allocator<boost::container::vec_iterator<std::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>>>*,true>>>
                          *)cofaces,iVar4,&local_38);
            }
            else {
              (iVar4._M_current)->m_ptr = local_38.m_ptr;
              (cofaces->
              super__Vector_base<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>_>_>
              )._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
            }
            if (!star) goto LAB_001643de;
          }
          if ((((local_38.m_ptr)->second).children_)->parent_ == (local_38.m_ptr)->first) {
            psVar2 = (vertices->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            local_42 = psVar2[-1];
            (vertices->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
            super__Vector_impl_data._M_finish = psVar2 + -1;
            rec_coface(this,vertices,((local_38.m_ptr)->second).children_,local_3c,cofaces,
                       SUB41(local_40,0),nbVertices);
            __position._M_current =
                 (vertices->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (vertices->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<short,std::allocator<short>>::_M_realloc_insert<short_const&>
                        ((vector<short,std::allocator<short>> *)vertices,__position,&local_42);
            }
            else {
              *__position._M_current = local_42;
              (vertices->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
          }
        }
        else {
          if (psVar3[-1] < sVar1) {
            return;
          }
          if ((((local_38.m_ptr)->second).children_)->parent_ == sVar1) goto LAB_0016432f;
        }
      }
LAB_001643de:
      if (local_38.m_ptr ==
          (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>
           *)0x0) {
        __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x98,
                      "vec_iterator<Pointer, IsConst> &boost::container::vec_iterator<std::pair<short, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>>> *, true>::operator++() [Pointer = std::pair<short, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>>> *, IsConst = true]"
                     );
      }
      local_38.m_ptr = local_38.m_ptr + 1;
    } while (local_38.m_ptr !=
             (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>
              *)((curr_sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_start +
                (curr_sib->members_).m_flat_tree.m_data.m_seq.m_holder.m_size));
  }
  return;
}

Assistant:

void rec_coface(std::vector<Vertex_handle> &vertices, Siblings const*curr_sib, int curr_nbVertices,
                  std::vector<Simplex_handle>& cofaces, bool star, int nbVertices) const {
    if (!(star || curr_nbVertices <= nbVertices))  // dimension of actual simplex <= nbVertices
      return;
    for (Simplex_handle simplex = curr_sib->members().begin(); simplex != curr_sib->members().end(); ++simplex) {
      if (vertices.empty()) {
        // If we reached the end of the vertices, and the simplex has more vertices than the given simplex
        // => we found a coface

        // Add a coface if we want the star or if the number of vertices of the current simplex matches with nbVertices
        bool addCoface = (star || curr_nbVertices == nbVertices);
        if (addCoface)
          cofaces.push_back(simplex);
        if ((!addCoface || star) && has_children(simplex))  // Rec call
          rec_coface(vertices, simplex->second.children(), curr_nbVertices + 1, cofaces, star, nbVertices);
      } else {
        if (simplex->first == vertices.back()) {
          // If curr_sib matches with the top vertex
          bool equalDim = (star || curr_nbVertices == nbVertices);  // dimension of actual simplex == nbVertices
          bool addCoface = vertices.size() == 1 && equalDim;
          if (addCoface)
            cofaces.push_back(simplex);
          if ((!addCoface || star) && has_children(simplex)) {
            // Rec call
            Vertex_handle tmp = vertices.back();
            vertices.pop_back();
            rec_coface(vertices, simplex->second.children(), curr_nbVertices + 1, cofaces, star, nbVertices);
            vertices.push_back(tmp);
          }
        } else if (simplex->first > vertices.back()) {
          return;
        } else {
          // (simplex->first < vertices.back()
          if (has_children(simplex))
            rec_coface(vertices, simplex->second.children(), curr_nbVertices + 1, cofaces, star, nbVertices);
        }
      }
    }
  }